

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void __thiscall Bitmap::invert(Bitmap *this,int x1,int y1,int x2,int y2)

{
  int iVar1;
  int iVar2;
  int y;
  int iVar3;
  ulong uVar4;
  
  if (x1 < 1) {
    x1 = 0;
  }
  iVar3 = 0;
  if (0 < y1) {
    iVar3 = y1;
  }
  iVar1 = this->width;
  iVar2 = x2;
  if (iVar1 < x2) {
    iVar2 = iVar1;
  }
  if (this->height < y2) {
    y2 = this->height;
  }
  if (iVar3 < y2) {
    if (iVar1 < x2) {
      x2 = iVar1;
    }
    do {
      uVar4 = (ulong)(uint)x1;
      if (x1 < iVar2) {
        do {
          this->buffer[uVar4 + (long)iVar3 * (long)this->width] =
               ~this->buffer[uVar4 + (long)iVar3 * (long)this->width];
          uVar4 = uVar4 + 1;
        } while (x2 != (int)uVar4);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != y2);
  }
  return;
}

Assistant:

void
Bitmap::invert(int x1, int y1, int x2, int y2)
{
  x1 = std::max(0, x1);
  y1 = std::max(0, y1);

  x2 = std::min(width,  x2);
  y2 = std::min(height, y2);

  for(int y = y1; y < y2; ++y)
    for(int x = x1; x < x2; ++x)
    {
      buffer[y * width + x] = 255 - buffer[y * width + x];
    }
}